

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Add
          (PersistentStorageJson *this,BorderRouter *aValue,BorderRouterId *aRetId)

{
  Status SVar1;
  string local_60;
  string local_40;
  BorderRouterId *local_20;
  BorderRouterId *aRetId_local;
  BorderRouter *aValue_local;
  PersistentStorageJson *this_local;
  
  local_20 = aRetId;
  aRetId_local = (BorderRouterId *)aValue;
  aValue_local = (BorderRouter *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)JSON_BR_SEQ_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_60,(string *)JSON_BR_abi_cxx11_);
  SVar1 = AddOne<ot::commissioner::persistent_storage::BorderRouter,ot::commissioner::persistent_storage::BorderRouterId>
                    (this,aValue,aRetId,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Add(BorderRouter const &aValue, BorderRouterId &aRetId)
{
    return AddOne<BorderRouter, BorderRouterId>(aValue, aRetId, JSON_BR_SEQ, JSON_BR);
}